

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,UChar *left,int32_t leftLength,UChar *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  int32_t options;
  uint uVar1;
  CollationSettings *settings;
  Normalizer2Impl *nfcImpl;
  long lVar2;
  byte numeric;
  UBool UVar3;
  UChar UVar4;
  UCollationResult UVar5;
  int32_t leftLength_00;
  UChar *pUVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  UTF16CollationIterator rightIter;
  UTF16CollationIterator leftIter;
  int rightLength_00;
  UChar *local_478;
  UChar *local_470;
  undefined1 local_450 [48];
  UnicodeString local_420 [5];
  int32_t local_2e0;
  SkippedState *local_2d8;
  int32_t local_2d0;
  byte local_2cc;
  UChar *local_2c8;
  UChar *local_2c0;
  UChar *local_2b8;
  UChar *local_2b0;
  UChar *local_2a8;
  UChar *local_2a0;
  UChar *local_298;
  Normalizer2Impl *local_290;
  undefined **local_288;
  StackBufferOrFields local_280;
  int8_t local_248;
  undefined1 local_240 [48];
  UnicodeString local_210 [5];
  int32_t local_d0;
  SkippedState *local_c8;
  int32_t local_c0;
  byte local_bc;
  UChar *local_b8;
  UChar *local_b0;
  UChar *local_a8;
  UChar *local_a0;
  UChar *local_98;
  UChar *local_90;
  UChar *local_88;
  Normalizer2Impl *local_80;
  undefined **local_78;
  StackBufferOrFields local_70;
  int8_t local_38;
  
  UVar5 = UCOL_EQUAL;
  if (left != right || leftLength != rightLength) {
    if (leftLength < 0) {
      UVar4 = *left;
      if (UVar4 == *right) {
        uVar9 = 0;
        do {
          if (UVar4 == L'\0') {
            return UCOL_EQUAL;
          }
          uVar8 = uVar9 + 1;
          UVar4 = left[uVar9 + 1];
          lVar2 = uVar9 + 1;
          uVar9 = uVar8;
        } while (UVar4 == right[lVar2]);
      }
      else {
        uVar8 = 0;
      }
      local_470 = (UChar *)0x0;
      local_478 = (UChar *)0x0;
    }
    else {
      local_478 = left + (uint)leftLength;
      local_470 = right + rightLength;
      uVar8 = 0;
      if (leftLength != 0) {
        uVar9 = 0;
        do {
          uVar8 = (ulong)(uint)rightLength;
          if (((uint)rightLength == uVar9) || (uVar8 = uVar9, left[uVar9] != right[uVar9]))
          goto LAB_0022c050;
          uVar9 = uVar9 + 1;
        } while ((uint)leftLength != uVar9);
        uVar8 = (ulong)(uint)leftLength;
      }
      if ((int)uVar8 == rightLength) {
        return UCOL_EQUAL;
      }
    }
LAB_0022c050:
    numeric = (byte)this->settings->options >> 1 & 1;
    uVar7 = (uint)uVar8;
    if ((uVar7 != 0) &&
       (((uVar7 != leftLength &&
         (UVar3 = CollationData::isUnsafeBackward
                            (this->data,(uint)(ushort)left[uVar8 & 0xffffffff],numeric),
         UVar3 != '\0')) ||
        ((uVar7 != rightLength &&
         (UVar3 = CollationData::isUnsafeBackward
                            (this->data,(uint)(ushort)right[uVar8 & 0xffffffff],numeric),
         UVar3 != '\0')))))) {
      pUVar6 = left + (uVar7 - 1);
      do {
        if ((int)uVar8 < 2) {
          uVar7 = 0;
          break;
        }
        UVar3 = CollationData::isUnsafeBackward(this->data,(uint)(ushort)*pUVar6,numeric);
        uVar7 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar7;
        pUVar6 = pUVar6 + -1;
      } while (UVar3 != '\0');
    }
    options = this->settings->fastLatinOptions;
    UVar5 = ~UCOL_GREATER;
    if (((-1 < options) &&
        ((leftLength_00 = leftLength - uVar7, leftLength_00 == 0 ||
         ((ushort)left[(int)uVar7] < 0x180)))) &&
       ((rightLength_00 = rightLength - uVar7, rightLength_00 == 0 ||
        ((ushort)right[(int)uVar7] < 0x180)))) {
      if (leftLength < 0) {
        rightLength_00 = -1;
        leftLength_00 = -1;
      }
      UVar5 = CollationFastLatin::compareUTF16
                        (this->data->fastLatinTable,this->settings->fastLatinPrimaries,options,
                         left + (int)uVar7,leftLength_00,right + (int)uVar7,rightLength_00);
    }
    if (UVar5 == ~UCOL_GREATER) {
      settings = this->settings;
      local_b0 = left + (int)uVar7;
      local_2cc = numeric;
      local_2c8 = right;
      local_bc = numeric;
      local_b8 = left;
      if ((settings->options & 1) == 0) {
        local_450._16_8_ = this->data;
        local_240._32_8_ = local_210;
        local_240._8_8_ = *(undefined8 *)local_450._16_8_;
        local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
        local_240._40_5_ = 0x28;
        local_d0 = 0;
        local_c8 = (SkippedState *)0x0;
        local_c0 = -1;
        local_240._0_8_ = &PTR__UTF16CollationIterator_003e7980;
        local_a8 = local_478;
        local_2c0 = right + (int)uVar7;
        local_450._32_8_ = local_420;
        local_450._8_8_ = *(undefined8 *)local_450._16_8_;
        local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
        local_450._40_5_ = 0x28;
        local_2e0 = 0;
        local_2d8 = (SkippedState *)0x0;
        local_2d0 = -1;
        local_450._0_8_ = &PTR__UTF16CollationIterator_003e7980;
        local_2b8 = local_470;
        local_240._16_8_ = local_450._16_8_;
        UVar5 = CollationCompare::compareUpToQuaternary
                          ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                           errorCode);
        UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)local_450);
        UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)local_240);
      }
      else {
        local_450._16_8_ = this->data;
        local_240._32_8_ = local_210;
        local_240._8_8_ = *(undefined8 *)local_450._16_8_;
        local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
        local_240._40_5_ = 0x28;
        local_d0 = 0;
        local_c8 = (SkippedState *)0x0;
        local_c0 = -1;
        local_a8 = local_478;
        local_240._0_8_ = &PTR__FCDUTF16CollationIterator_003e7a10;
        local_90 = (UChar *)0x0;
        local_88 = local_478;
        local_80 = *(Normalizer2Impl **)(local_450._16_8_ + 0x30);
        local_78 = &PTR__UnicodeString_003f7be0;
        local_70.fStackFields.fLengthAndFlags = 2;
        local_38 = '\x01';
        local_450._32_8_ = local_420;
        local_450._8_8_ = *(undefined8 *)local_450._16_8_;
        local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
        local_450._40_5_ = 0x28;
        local_2e0 = 0;
        local_2d8 = (SkippedState *)0x0;
        local_2d0 = -1;
        local_2c0 = right + (int)uVar7;
        local_2b8 = local_470;
        local_450._0_8_ = &PTR__FCDUTF16CollationIterator_003e7a10;
        local_2a0 = (UChar *)0x0;
        local_298 = local_470;
        local_290 = *(Normalizer2Impl **)(local_450._16_8_ + 0x30);
        local_288 = &PTR__UnicodeString_003f7be0;
        local_280.fStackFields.fLengthAndFlags = 2;
        local_248 = '\x01';
        local_2b0 = right;
        local_2a8 = local_2c0;
        local_240._16_8_ = local_450._16_8_;
        local_a0 = left;
        local_98 = local_b0;
        UVar5 = CollationCompare::compareUpToQuaternary
                          ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                           errorCode);
        FCDUTF16CollationIterator::~FCDUTF16CollationIterator
                  ((FCDUTF16CollationIterator *)local_450);
        FCDUTF16CollationIterator::~FCDUTF16CollationIterator
                  ((FCDUTF16CollationIterator *)local_240);
      }
    }
    if (((UVar5 == UCOL_EQUAL) && (uVar1 = this->settings->options, 0xefff < (int)uVar1)) &&
       (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
      nfcImpl = this->data->nfcImpl;
      if ((uVar1 & 1) == 0) {
        local_240._24_8_ = 0xffffffff;
        local_240._0_8_ = &PTR__UObject_003e7450;
        local_240._40_8_ = local_478;
        local_450._24_8_ = 0xffffffff;
        local_450._0_8_ = &PTR__UObject_003e7450;
        local_450._40_8_ = local_470;
        local_450._32_8_ = (UnicodeString *)(right + (int)uVar7);
        local_240._32_8_ = (UnicodeString *)(left + (int)uVar7);
        UVar5 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
        UObject::~UObject((UObject *)local_450);
      }
      else {
        anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)local_240,nfcImpl,left + (int)uVar7,local_478);
        anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)local_450,nfcImpl,right + (int)uVar7,local_470);
        UVar5 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
        local_450._0_8_ = &PTR__FCDUTF16NFDIterator_003e74e0;
        UnicodeString::~UnicodeString(local_420);
        UObject::~UObject((UObject *)local_450);
        local_240._0_8_ = &PTR__FCDUTF16NFDIterator_003e74e0;
        UnicodeString::~UnicodeString(local_210);
      }
      UObject::~UObject((UObject *)local_240);
    }
  }
  return UVar5;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const UChar *left, int32_t leftLength,
                             const UChar *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    const UChar *leftLimit;
    const UChar *rightLimit;
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        leftLimit = NULL;
        rightLimit = NULL;
        UChar c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        leftLimit = left + leftLength;
        rightLimit = right + rightLength;
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        if((equalPrefixLength != leftLength &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) ||
                (equalPrefixLength != rightLength &&
                    data->isUnsafeBackward(right[equalPrefixLength], numeric))) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            while(--equalPrefixLength > 0 &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) {}
        }
        // Notes:
        // - A longer string can compare equal to a prefix of it if only ignorables follow.
        // - With a backward level, a longer string can compare less-than a prefix of it.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength,
                                                      leftLength - equalPrefixLength,
                                                      right + equalPrefixLength,
                                                      rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength, -1,
                                                      right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF16CollationIterator leftIter(data, numeric,
                                            left, left + equalPrefixLength, leftLimit);
            UTF16CollationIterator rightIter(data, numeric,
                                            right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF16CollationIterator leftIter(data, numeric,
                                              left, left + equalPrefixLength, leftLimit);
            FCDUTF16CollationIterator rightIter(data, numeric,
                                                right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(settings->dontCheckFCD()) {
        UTF16NFDIterator leftIter(left, leftLimit);
        UTF16NFDIterator rightIter(right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF16NFDIterator leftIter(nfcImpl, left, leftLimit);
        FCDUTF16NFDIterator rightIter(nfcImpl, right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}